

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

SuspendedRequest * __thiscall
kj::HttpServer::Connection::suspend
          (SuspendedRequest *__return_storage_ptr__,Connection *this,SuspendableRequest *suspendable
          )

{
  uint uVar1;
  uchar *puVar2;
  size_t sVar3;
  StringPtr url;
  bool bVar4;
  ArrayPtr<unsigned_char> leftoverParam;
  DebugExpression<bool> _kjCondition;
  Fault f;
  DebugExpression<bool> local_f9;
  Array<unsigned_char> local_f8;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_d8;
  Fault local_c8;
  undefined8 uStack_c0;
  ArrayDisposer *local_b8;
  uchar *local_b0;
  size_t local_a8;
  char *local_98;
  size_t sStack_90;
  HttpHeaders local_88;
  
  local_f8.ptr = (uchar *)(this->httpInput).headerBuffer.ptr;
  puVar2 = (uchar *)(this->httpInput).leftover.ptr;
  if ((long)puVar2 - (long)(local_f8.ptr + (this->httpInput).messageHeaderEnd) == 1) {
    bVar4 = puVar2[-1] == '\n';
  }
  else if ((((long)puVar2 - (long)(local_f8.ptr + (this->httpInput).messageHeaderEnd) != 2) ||
           (puVar2[-1] != '\n')) || (bVar4 = true, puVar2[-2] != '\r')) {
    bVar4 = false;
  }
  if ((this->httpInput).broken == true) {
    local_f9.value = false;
  }
  else {
    local_f8.size_ = (this->httpInput).headerBuffer.size_;
    local_f9.value = (bool)(local_f8.size_ != 0 & bVar4);
    if (local_f9.value) {
      local_f8.disposer = (this->httpInput).headerBuffer.disposer;
      if (local_f8.disposer == (ArrayDisposer *)0x0) {
        local_b8 = (ArrayDisposer *)0x0;
        local_f8.size_ = 0;
        local_f8.ptr = (uchar *)0x0;
      }
      else {
        (this->httpInput).headerBuffer.ptr = (char *)0x0;
        (this->httpInput).headerBuffer.size_ = 0;
        local_b8 = local_f8.disposer;
      }
      sVar3 = (this->httpInput).leftover.size_;
      local_c8.exception = (Exception *)0x0;
      uStack_c0 = 0;
      uVar1 = (suspendable->method).tag;
      if (uVar1 == 1) {
        local_d8.field_1.space = (byte  [4])*(undefined4 *)&(suspendable->method).field_1;
      }
      local_98 = (suspendable->url).content.ptr;
      sStack_90 = (suspendable->url).content.size_;
      local_d8.tag = uVar1;
      local_b0 = puVar2;
      local_a8 = sVar3;
      HttpHeaders::cloneShallow(&local_88,suspendable->headers);
      url.content.size_ = sStack_90;
      url.content.ptr = local_98;
      leftoverParam.size_ = sVar3;
      leftoverParam.ptr = puVar2;
      SuspendedRequest::SuspendedRequest
                (__return_storage_ptr__,&local_f8,leftoverParam,&local_d8,url,&local_88);
      HttpHeaders::~HttpHeaders(&local_88);
      sVar3 = local_f8.size_;
      puVar2 = local_f8.ptr;
      if (uVar1 - 1 < 2) {
        local_d8.tag = 0;
      }
      if (local_f8.ptr != (uchar *)0x0) {
        local_f8.ptr = (uchar *)0x0;
        local_f8.size_ = 0;
        (**(local_f8.disposer)->_vptr_ArrayDisposer)(local_f8.disposer,puVar2,1,sVar3,sVar3,0);
      }
      this->suspended = true;
      return __return_storage_ptr__;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[65]>
            (&local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1d0a,FAILED,"httpInput.canSuspend()",
             "_kjCondition,\"suspend() may only be called before the request body is consumed\"",
             &local_f9,
             (char (*) [65])"suspend() may only be called before the request body is consumed");
  kj::_::Debug::Fault::fatal(&local_c8);
}

Assistant:

SuspendedRequest suspend(SuspendableRequest& suspendable) {
    KJ_REQUIRE(httpInput.canSuspend(),
        "suspend() may only be called before the request body is consumed");
    KJ_DEFER(suspended = true);
    auto released = httpInput.releaseBuffer();
    return {
      kj::mv(released.buffer),
      released.leftover,
      suspendable.method,
      suspendable.url,
      suspendable.headers.cloneShallow(),
    };
  }